

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_CreateTaprootAddress_Test::~AddressFactory_CreateTaprootAddress_Test
          (AddressFactory_CreateTaprootAddress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AddressFactory, CreateTaprootAddress)
{
  AddressFactory factory;
  Address addr;
  const SchnorrPubkey pubkey = SchnorrPubkey(
    "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey.GetByteData256()));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  ScriptBuilder build;
  build.AppendOperator(ScriptOperator::OP_TRUE);
  TaprootScriptTree tree(build.Build());
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(tree, pubkey));
  EXPECT_EQ("bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah", addr.GetAddress());
}